

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_relaxation.c
# Opt level: O3

int ARKodeSetRelaxUpperBound(void *arkode_mem,sunrealtype upper)

{
  int iVar1;
  ARKodeRelaxMem relax_mem;
  ARKodeMem ark_mem;
  ARKodeRelaxMem local_18;
  ARKodeMem local_10;
  
  iVar1 = arkRelaxAccessMem(arkode_mem,"ARKodeSetRelaxUpperBound",&local_10,&local_18);
  if (iVar1 == 0) {
    if (local_10->step_supports_relaxation == 0) {
      iVar1 = -0x30;
      arkProcessError(local_10,-0x30,0x26f,"ARKodeSetRelaxUpperBound",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_relaxation.c"
                      ,"time-stepping module does not support relaxation");
    }
    else {
      if (upper <= 1.0) {
        local_18->upper_bound = 1.2;
      }
      else {
        local_18->upper_bound = upper;
      }
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int ARKodeSetRelaxUpperBound(void* arkode_mem, sunrealtype upper)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeRelaxMem relax_mem;

  retval = arkRelaxAccessMem(arkode_mem, __func__, &ark_mem, &relax_mem);
  if (retval) { return retval; }

  /* Guard against use for time steppers that do not allow relaxation */
  if (!ark_mem->step_supports_relaxation)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support relaxation");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  if (upper > ONE) { relax_mem->upper_bound = upper; }
  else { relax_mem->upper_bound = ARK_RELAX_DEFAULT_UPPER_BOUND; }

  return ARK_SUCCESS;
}